

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_backend.c
# Opt level: O0

int ossl_rsa_pss_get_param_unverified
              (RSA_PSS_PARAMS *pss,EVP_MD **pmd,EVP_MD **pmgf1md,int *psaltlen,int *ptrailerField)

{
  int iVar1;
  EVP_MD *pEVar2;
  long lVar3;
  int *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  int *in_R8;
  RSA_PSS_PARAMS_30 pss_params;
  X509_ALGOR *in_stack_ffffffffffffffb8;
  int local_4;
  
  ossl_rsa_pss_params_30_set_defaults((RSA_PSS_PARAMS_30 *)&stack0xffffffffffffffbc);
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    pEVar2 = ossl_x509_algor_get_md(in_stack_ffffffffffffffb8);
    *in_RSI = (long)pEVar2;
    if (*in_RSI == 0) {
      local_4 = 0;
    }
    else {
      pEVar2 = ossl_x509_algor_get_md(in_stack_ffffffffffffffb8);
      *in_RDX = (long)pEVar2;
      if (*in_RDX == 0) {
        local_4 = 0;
      }
      else {
        if (*(long *)(in_RDI + 0x10) == 0) {
          iVar1 = ossl_rsa_pss_params_30_saltlen((RSA_PSS_PARAMS_30 *)&stack0xffffffffffffffbc);
          *in_RCX = iVar1;
        }
        else {
          lVar3 = ASN1_INTEGER_get(*(ASN1_INTEGER **)(in_RDI + 0x10));
          *in_RCX = (int)lVar3;
        }
        if (*(long *)(in_RDI + 0x18) == 0) {
          iVar1 = ossl_rsa_pss_params_30_trailerfield((RSA_PSS_PARAMS_30 *)&stack0xffffffffffffffbc)
          ;
          *in_R8 = iVar1;
        }
        else {
          lVar3 = ASN1_INTEGER_get(*(ASN1_INTEGER **)(in_RDI + 0x18));
          *in_R8 = (int)lVar3;
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int ossl_rsa_pss_get_param_unverified(const RSA_PSS_PARAMS *pss,
                                      const EVP_MD **pmd, const EVP_MD **pmgf1md,
                                      int *psaltlen, int *ptrailerField)
{
    RSA_PSS_PARAMS_30 pss_params;

    /* Get the defaults from the ONE place */
    (void)ossl_rsa_pss_params_30_set_defaults(&pss_params);

    if (pss == NULL)
        return 0;
    *pmd = ossl_x509_algor_get_md(pss->hashAlgorithm);
    if (*pmd == NULL)
        return 0;
    *pmgf1md = ossl_x509_algor_get_md(pss->maskHash);
    if (*pmgf1md == NULL)
        return 0;
    if (pss->saltLength)
        *psaltlen = ASN1_INTEGER_get(pss->saltLength);
    else
        *psaltlen = ossl_rsa_pss_params_30_saltlen(&pss_params);
    if (pss->trailerField)
        *ptrailerField = ASN1_INTEGER_get(pss->trailerField);
    else
        *ptrailerField = ossl_rsa_pss_params_30_trailerfield(&pss_params);;

    return 1;
}